

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

void __thiscall QAbstractItemView::focusInEvent(QAbstractItemView *this,QFocusEvent *event)

{
  undefined1 uVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  bool bVar8;
  bool bVar9;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)(this + 8);
  QWidget::focusInEvent((QWidget *)this,event);
  lVar3 = *(long *)(*(long *)(this + 8) + 800);
  bVar8 = true;
  if ((lVar3 != 0) && (*(int *)(lVar3 + 4) != 0)) {
    bVar8 = *(long *)(*(long *)(this + 8) + 0x328) == 0;
  }
  currentIndex(&local_58,this);
  bVar9 = false;
  if ((-1 < local_58.r) && (bVar9 = false, -1 < local_58.c)) {
    bVar9 = local_58.m.ptr != (QAbstractItemModel *)0x0;
  }
  if ((!bVar8) && (*(char *)(lVar2 + 0x490) == '\0' && !bVar9)) {
    uVar1 = *(undefined1 *)(lVar2 + 0x418);
    *(undefined1 *)(lVar2 + 0x418) = 0;
    local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.r = -0x55555556;
    local_58.c = -0x55555556;
    local_58.i._0_4_ = 0xaaaaaaaa;
    local_58.i._4_4_ = 0xaaaaaaaa;
    (**(code **)(*(long *)this + 0x2a8))(&local_58,this,8,0);
    if (((-1 < local_58.r) &&
        (((-1 < local_58.c && (local_58.m.ptr != (QAbstractItemModel *)0x0)) &&
         (uVar7 = (**(code **)(**(long **)(lVar2 + 0x2f8) + 0x138))
                            (*(long **)(lVar2 + 0x2f8),&local_58), (uVar7 & 0x20) != 0)))) &&
       (iVar5 = QFocusEvent::reason(), iVar5 != 0)) {
      plVar4 = *(long **)(*(long *)(this + 8) + 0x328);
      (**(code **)(*plVar4 + 0x60))
                (plVar4,&local_58,0,*(undefined4 *)(*(long *)(*(long *)(this + 8) + 800) + 4));
      bVar9 = true;
    }
    *(undefined1 *)(lVar2 + 0x418) = uVar1;
  }
  if (!bVar8 && bVar9) {
    currentIndex(&local_58,this);
    if (local_58.m.ptr == (QAbstractItemModel *)0x0) {
      bVar8 = false;
    }
    else {
      uVar6 = (**(code **)(*(long *)local_58.m.ptr + 0x138))(local_58.m.ptr,&local_58);
      bVar8 = SUB41((uVar6 & 2) >> 1,0);
    }
  }
  else {
    if (bVar9) goto LAB_0053f8cd;
    bVar8 = false;
  }
  QWidget::setAttribute((QWidget *)this,WA_InputMethodEnabled,bVar8);
LAB_0053f8cd:
  QWidget::update(*(QWidget **)(lVar2 + 0x2b0));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemView::focusInEvent(QFocusEvent *event)
{
    Q_D(QAbstractItemView);
    QAbstractScrollArea::focusInEvent(event);

    const QItemSelectionModel* model = selectionModel();
    bool currentIndexValid = currentIndex().isValid();

    if (model
        && !d->currentIndexSet
        && !currentIndexValid) {
        bool autoScroll = d->autoScroll;
        d->autoScroll = false;
        QModelIndex index = moveCursor(MoveNext, Qt::NoModifier); // first visible index
        if (index.isValid() && d->isIndexEnabled(index) && event->reason() != Qt::MouseFocusReason) {
            selectionModel()->setCurrentIndex(index, QItemSelectionModel::NoUpdate);
            currentIndexValid = true;
        }
        d->autoScroll = autoScroll;
    }

    if (model && currentIndexValid)
        setAttribute(Qt::WA_InputMethodEnabled, (currentIndex().flags() & Qt::ItemIsEditable));
    else if (!currentIndexValid)
        setAttribute(Qt::WA_InputMethodEnabled, false);

    d->viewport->update();
}